

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjDecompressHeader3(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,int *width,int *height
                       ,int *jpegSubsamp,int *jpegColorspace)

{
  int iVar1;
  j_decompress_ptr cinfo;
  JDIMENSION *in_RCX;
  long in_RDX;
  long in_RSI;
  uchar *in_RDI;
  JDIMENSION *in_R8;
  int *in_R9;
  long *in_FS_OFFSET;
  j_decompress_ptr dinfo;
  tjinstance *this;
  int retval;
  undefined8 in_stack_ffffffffffffffa8;
  boolean require_image;
  undefined4 in_stack_ffffffffffffffc0;
  int local_4;
  
  require_image = (boolean)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_4 = 0;
  if (in_RDI == (uchar *)0x0) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"Invalid handle");
    local_4 = -1;
  }
  else {
    cinfo = (j_decompress_ptr)(in_RDI + 0x208);
    in_RDI[0x5f8] = '\0';
    in_RDI[0x5f9] = '\0';
    in_RDI[0x5fa] = '\0';
    in_RDI[0x5fb] = '\0';
    in_RDI[0x6d0] = '\0';
    in_RDI[0x6d1] = '\0';
    in_RDI[0x6d2] = '\0';
    in_RDI[0x6d3] = '\0';
    if ((*(uint *)(in_RDI + 0x600) & 2) == 0) {
      snprintf((char *)(in_RDI + 0x608),200,"%s",
               "tjDecompressHeader3(): Instance has not been initialized for decompression");
      in_RDI[0x6d0] = '\x01';
      in_RDI[0x6d1] = '\0';
      in_RDI[0x6d2] = '\0';
      in_RDI[0x6d3] = '\0';
      snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
               "tjDecompressHeader3(): Instance has not been initialized for decompression");
      local_4 = -1;
    }
    else if (((((in_RSI == 0) || (in_RDX == 0)) || (in_RCX == (JDIMENSION *)0x0)) ||
             ((in_R8 == (JDIMENSION *)0x0 || (in_R9 == (int *)0x0)))) ||
            (dinfo == (j_decompress_ptr)0x0)) {
      snprintf((char *)(in_RDI + 0x608),200,"%s","tjDecompressHeader3(): Invalid argument");
      in_RDI[0x6d0] = '\x01';
      in_RDI[0x6d1] = '\0';
      in_RDI[0x6d2] = '\0';
      in_RDI[0x6d3] = '\0';
      snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjDecompressHeader3(): Invalid argument");
      local_4 = -1;
    }
    else {
      iVar1 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x528));
      if (iVar1 != 0) {
        return -1;
      }
      jpeg_mem_src_tj((j_decompress_ptr)CONCAT44(local_4,in_stack_ffffffffffffffc0),in_RDI,
                      (unsigned_long)cinfo);
      jpeg_read_header(cinfo,require_image);
      *in_RCX = cinfo->image_width;
      *in_R8 = cinfo->image_height;
      iVar1 = getSubsamp(cinfo);
      *in_R9 = iVar1;
      switch(cinfo->jpeg_color_space) {
      case JCS_GRAYSCALE:
        *(undefined4 *)&dinfo->err = 2;
        break;
      case JCS_RGB:
        *(undefined4 *)&dinfo->err = 0;
        break;
      case JCS_YCbCr:
        *(undefined4 *)&dinfo->err = 1;
        break;
      case JCS_CMYK:
        *(undefined4 *)&dinfo->err = 3;
        break;
      case JCS_YCCK:
        *(undefined4 *)&dinfo->err = 4;
        break;
      default:
        *(undefined4 *)&dinfo->err = 0xffffffff;
      }
      jpeg_abort_decompress((j_decompress_ptr)0x110860);
      if (*in_R9 < 0) {
        snprintf((char *)(in_RDI + 0x608),200,"%s",
                 "tjDecompressHeader3(): Could not determine subsampling type for JPEG image");
        in_RDI[0x6d0] = '\x01';
        in_RDI[0x6d1] = '\0';
        in_RDI[0x6d2] = '\0';
        in_RDI[0x6d3] = '\0';
        snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                 "tjDecompressHeader3(): Could not determine subsampling type for JPEG image");
        local_4 = -1;
      }
      else if (*(int *)&dinfo->err < 0) {
        snprintf((char *)(in_RDI + 0x608),200,"%s",
                 "tjDecompressHeader3(): Could not determine colorspace of JPEG image");
        in_RDI[0x6d0] = '\x01';
        in_RDI[0x6d1] = '\0';
        in_RDI[0x6d2] = '\0';
        in_RDI[0x6d3] = '\0';
        snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                 "tjDecompressHeader3(): Could not determine colorspace of JPEG image");
        local_4 = -1;
      }
      else if (((int)*in_RCX < 1) || ((int)*in_R8 < 1)) {
        snprintf((char *)(in_RDI + 0x608),200,"%s",
                 "tjDecompressHeader3(): Invalid data returned in header");
        in_RDI[0x6d0] = '\x01';
        in_RDI[0x6d1] = '\0';
        in_RDI[0x6d2] = '\0';
        in_RDI[0x6d3] = '\0';
        snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                 "tjDecompressHeader3(): Invalid data returned in header");
        local_4 = -1;
      }
    }
    if (*(int *)(in_RDI + 0x5f8) != 0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

DLLEXPORT int tjDecompressHeader3(tjhandle handle,
                                  const unsigned char *jpegBuf,
                                  unsigned long jpegSize, int *width,
                                  int *height, int *jpegSubsamp,
                                  int *jpegColorspace)
{
  int retval = 0;

  GET_DINSTANCE(handle);
  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecompressHeader3(): Instance has not been initialized for decompression");

  if (jpegBuf == NULL || jpegSize <= 0 || width == NULL || height == NULL ||
      jpegSubsamp == NULL || jpegColorspace == NULL)
    THROW("tjDecompressHeader3(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    return -1;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
  jpeg_read_header(dinfo, TRUE);

  *width = dinfo->image_width;
  *height = dinfo->image_height;
  *jpegSubsamp = getSubsamp(dinfo);
  switch (dinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:  *jpegColorspace = TJCS_GRAY;  break;
  case JCS_RGB:        *jpegColorspace = TJCS_RGB;  break;
  case JCS_YCbCr:      *jpegColorspace = TJCS_YCbCr;  break;
  case JCS_CMYK:       *jpegColorspace = TJCS_CMYK;  break;
  case JCS_YCCK:       *jpegColorspace = TJCS_YCCK;  break;
  default:             *jpegColorspace = -1;  break;
  }

  jpeg_abort_decompress(dinfo);

  if (*jpegSubsamp < 0)
    THROW("tjDecompressHeader3(): Could not determine subsampling type for JPEG image");
  if (*jpegColorspace < 0)
    THROW("tjDecompressHeader3(): Could not determine colorspace of JPEG image");
  if (*width < 1 || *height < 1)
    THROW("tjDecompressHeader3(): Invalid data returned in header");

bailout:
  if (this->jerr.warning) retval = -1;
  return retval;
}